

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Echo.cpp
# Opt level: O2

Echo * __thiscall helics::apps::Echo::operator=(Echo *this,Echo *other_echo)

{
  CLI::std::deque<helics::Endpoint,_std::allocator<helics::Endpoint>_>::_M_move_assign1
            (&this->endpoints,&other_echo->endpoints);
  std::mutex::lock((mutex *)&this->delayTimeLock);
  (this->delayTime).internalTimeCode = (other_echo->delayTime).internalTimeCode;
  this->echoCounter = other_echo->echoCounter;
  App::operator=(&this->super_App,&other_echo->super_App);
  pthread_mutex_unlock((pthread_mutex_t *)&this->delayTimeLock);
  return this;
}

Assistant:

Echo& Echo::operator=(Echo&& other_echo) noexcept
    {
        endpoints = std::move(other_echo.endpoints);
        std::lock_guard<std::mutex> lock(delayTimeLock);
        delayTime = other_echo.delayTime;
        echoCounter = other_echo.echoCounter;
        App::operator=(std::move(other_echo));
        return *this;
    }